

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio-lite.cpp
# Opt level: O3

void archivateFiles(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *filesToArchivate,string *pathToOutArchive)

{
  bool bVar1;
  __off_t __n;
  uint uVar2;
  char *buf;
  ulong uVar3;
  void *__s;
  size_t sVar4;
  runtime_error *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ulong uVar5;
  ulong uVar6;
  pointer pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename;
  pointer pbVar8;
  char additionalNullTerminator;
  DescriptorWrapper fdArch;
  DescriptorWrapper fdToArchivate;
  header_old_cpio header;
  stat st;
  undefined1 local_119;
  DescriptorWrapper local_118;
  DescriptorWrapper local_114;
  string *local_110;
  pointer local_108;
  undefined1 *local_100 [2];
  undefined1 local_f0 [22];
  header_old_cpio local_da;
  stat local_c0;
  
  pbVar8 = (filesToArchivate->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar7 = (filesToArchivate->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_110 = pathToOutArchive;
  if (pbVar8 != pbVar7) {
    do {
      DescriptorWrapper::openFile((DescriptorWrapper *)&local_c0,pbVar8,0);
      DescriptorWrapper::~DescriptorWrapper((DescriptorWrapper *)&local_c0);
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar7);
  }
  DescriptorWrapper::createFile(&local_118,local_110,0x41,0x1b4);
  local_119 = 0;
  pbVar8 = (filesToArchivate->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar7 = (filesToArchivate->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 != pbVar7) {
    local_108 = pbVar7;
    do {
      PosixWrapper::lstat_(pbVar8,&local_c0);
      fillInHeader(&local_da,&local_c0,pbVar8);
      DescriptorWrapper::writeFrom(&local_118,&local_da,0x1a);
      DescriptorWrapper::writeFrom(&local_118,(pbVar8->_M_dataplus)._M_p,(ulong)local_da.c_namesize)
      ;
      if ((local_da.c_namesize & 1) != 0) {
        DescriptorWrapper::writeFrom(&local_118,&local_119,1);
      }
      __n = local_c0.st_size;
      uVar2 = local_da.c_mode - 0x1000 >> 0xc;
      if (0xb < uVar2) {
LAB_00104153:
        this = (runtime_error *)__cxa_allocate_exception(0x18);
        local_100[0] = local_f0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"Unknown filetype","");
        std::runtime_error::runtime_error(this,(string *)local_100);
        *(undefined ***)this = &PTR__runtime_error_00108d50;
        *(undefined4 *)(this + 0x10) = 1;
        __cxa_throw(this,&CpioException::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((0x82bU >> (uVar2 & 0x1f) & 1) == 0) {
        if (uVar2 == 7) {
          DescriptorWrapper::openFile((DescriptorWrapper *)local_100,pbVar8,0);
          uVar3 = local_c0.st_size;
          __s = operator_new__(0x200);
          memset(__s,0,0x200);
          uVar5 = uVar3;
          if (0 < (long)uVar3) {
            do {
              sVar4 = 0x200;
              if (uVar5 < 0x200) {
                sVar4 = uVar5;
              }
              sVar4 = DescriptorWrapper::readTo((DescriptorWrapper *)local_100,__s,sVar4);
              DescriptorWrapper::writeFrom(&local_118,__s,sVar4);
              uVar6 = uVar5 - sVar4;
              bVar1 = (long)sVar4 <= (long)uVar5;
              uVar3 = local_c0.st_size;
              uVar5 = uVar6;
            } while (uVar6 != 0 && bVar1);
          }
          if ((uVar3 & 0x8000000000000001) == 1) {
            DescriptorWrapper::writeFrom(&local_118,&local_119,1);
          }
          operator_delete__(__s);
          DescriptorWrapper::~DescriptorWrapper((DescriptorWrapper *)local_100);
          pbVar7 = local_108;
        }
        else {
          if (uVar2 != 9) goto LAB_00104153;
          buf = (char *)operator_new__(local_c0.st_size);
          memset(buf,0,__n);
          uVar3 = PosixWrapper::readlink_(pbVar8,buf,__n);
          DescriptorWrapper::writeFrom(&local_118,buf,uVar3);
          if ((uVar3 & 0x8000000000000001) == 1) {
            DescriptorWrapper::writeFrom(&local_118,&local_119,1);
          }
          operator_delete__(buf);
        }
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar7);
  }
  local_114.m_fd = local_118.m_fd;
  writeTrailer(&local_114);
  DescriptorWrapper::~DescriptorWrapper(&local_114);
  DescriptorWrapper::~DescriptorWrapper(&local_118);
  return;
}

Assistant:

void archivateFiles(const vector<string>& filesToArchivate, const string& pathToOutArchive) 
{
	// check all files can be opened
	for (const auto& filename: filesToArchivate) {
		DescriptorWrapper fd = DescriptorWrapper::openFile(filename, O_RDONLY);
	}

	auto fdArch = DescriptorWrapper::createFile(pathToOutArchive, O_WRONLY | O_CREAT, ACCESS_RW_RW_R__);
	header_old_cpio header;
	char additionalNullTerminator = 0;
	struct stat st;

	try
	{
		for (const auto& filename: filesToArchivate) {
			PosixWrapper::lstat_(filename, st);
			fillInHeader(header, st, filename);
			// write header 
			fdArch.writeFrom(&header, sizeof(header_old_cpio));
			// write filename
			fdArch.writeFrom((void*)filename.c_str(), header.c_namesize);
			if (header.c_namesize % 2 == 1)
				fdArch.writeFrom(&additionalNullTerminator, 1);
			// write file content 
			switch (header.c_mode & CP_IFMT) {
		    	case S_IFDIR:
				case S_IFCHR:
		    	case S_IFBLK:
		    	case S_IFSOCK:
		    	case S_IFIFO:
		    	{
		    		break;
		    	}
		    	case S_IFLNK:
		    	{
		    		auto bufPtr = make_unique<char[]>(st.st_size);
	    			auto size = PosixWrapper::readlink_(filename, bufPtr.get(), st.st_size);
	    			fdArch.writeFrom(bufPtr.get(), size);
	    			if (size % 2 == 1)
	    				fdArch.writeFrom(&additionalNullTerminator, 1);
		    		
		    		break;
		    	}
		    	case S_IFREG:
		    	{
					auto fdToArchivate = DescriptorWrapper::openFile(filename, O_RDONLY); 
					auto leftToCopy = st.st_size;
					auto bufPtr = make_unique<char[]>(BUFFER_BLOCK);
					while (leftToCopy > 0)
					{
						auto sz = fdToArchivate.readTo(bufPtr.get(), min<unsigned long>(BUFFER_BLOCK, leftToCopy));
						fdArch.writeFrom(bufPtr.get(), sz);
						leftToCopy -= sz;
					}
					if (st.st_size % 2 == 1)
						fdArch.writeFrom(&additionalNullTerminator, 1);
					
					break;
				}
				default:
				{
					throw CpioException(CpioException::InvalidInputFileToArchive, "Unknown filetype");
				}
			}
		}

		writeTrailer(fdArch);
	}
	catch (exception& e) 
	{
		unlink(pathToOutArchive.c_str());
		throw;
	}

	return;
}